

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::destruct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x1f0) != (long *)((long)ptr + 0x200)) {
    operator_delete(*(long **)((long)ptr + 0x1f0),*(long *)((long)ptr + 0x200) + 1);
  }
  Source::~Source((Source *)((long)ptr + 0xb0));
  if (*(long **)((long)ptr + 0x78) != (long *)((long)ptr + 0x88)) {
    operator_delete(*(long **)((long)ptr + 0x78),*(long *)((long)ptr + 0x88) + 1);
  }
  if (*(long **)((long)ptr + 0x40) != (long *)((long)ptr + 0x50)) {
    operator_delete(*(long **)((long)ptr + 0x40),*(long *)((long)ptr + 0x50) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }